

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfa.cc
# Opt level: O0

Thread * __thiscall re2::NFA::AllocThread(NFA *this)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  void *pvVar3;
  Thread *t;
  NFA *this_local;
  
  this_local = (NFA *)this->free_threads_;
  if (this_local == (NFA *)0x0) {
    this_local = (NFA *)operator_new(0x10);
    *(undefined4 *)&this_local->prog_ = 1;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)this->ncapture_;
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    pvVar3 = operator_new__(uVar2);
    *(void **)&this_local->start_ = pvVar3;
  }
  else {
    this->free_threads_ = (Thread *)*(anon_union_8_2_62753a03_for_Thread_0 *)&this_local->prog_;
    ((anon_union_8_2_62753a03_for_Thread_0 *)&this_local->prog_)->ref = 1;
  }
  return (Thread *)this_local;
}

Assistant:

NFA::Thread* NFA::AllocThread() {
  Thread* t = free_threads_;
  if (t == NULL) {
    t = new Thread;
    t->ref = 1;
    t->capture = new const char*[ncapture_];
    return t;
  }
  free_threads_ = t->next;
  t->ref = 1;
  return t;
}